

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::on_peer_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *host_list,
          int port,protocol_version v)

{
  int *piVar1;
  ip_filter *this_00;
  peer_list *ppVar2;
  int iVar3;
  uint uVar4;
  torrent_peer *ptVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  int __type;
  endpoint host;
  undefined1 local_90 [24];
  element_type *local_78;
  string local_70;
  data_union local_4c;
  
  if ((e->failed_ == true) &&
     (iVar3 = (*(this->super_request_callback)._vptr_request_callback[6])(this), (char)iVar3 != '\0'
     )) {
    (*e->cat_->_vptr_error_category[4])(&local_70,e->cat_,(ulong)(uint)e->val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"peer name lookup error: %s",local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((e->failed_ == false) && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) &&
      ((host_list->
       super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
       _M_impl.super__Vector_impl_data._M_start !=
       (host_list->
       super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>).
       _M_impl.super__Vector_impl_data._M_finish)) &&
     (iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x11])(), (char)iVar3 == '\0')) {
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)&local_4c.base,
               (host_list->
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               )._M_impl.super__Vector_impl_data._M_start,(unsigned_short)port);
    this_00 = (this->m_ip_filter).
              super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (ip_filter *)0x0) {
      if (local_4c.base.sa_family == 2) {
        local_70._M_dataplus._M_p = (pointer)((ulong)local_4c.v6.sin6_flowinfo << 0x20);
        local_70._M_string_length._0_1_ = '\0';
        local_70._M_string_length._1_1_ = '\0';
        local_70._M_string_length._2_1_ = '\0';
        local_70._M_string_length._3_1_ = '\0';
        local_70._M_string_length._4_1_ = '\0';
        local_70._M_string_length._5_1_ = '\0';
        local_70._M_string_length._6_1_ = '\0';
        local_70._M_string_length._7_1_ = '\0';
        local_70.field_2._M_allocated_capacity = 0;
        local_70.field_2._8_8_ = 0;
      }
      else {
        local_70._M_string_length._0_1_ = local_4c.base.sa_data[6];
        local_70._M_string_length._1_1_ = local_4c.base.sa_data[7];
        local_70._M_string_length._2_1_ = local_4c.base.sa_data[8];
        local_70._M_string_length._3_1_ = local_4c.base.sa_data[9];
        local_70._M_string_length._4_1_ = local_4c.base.sa_data[10];
        local_70._M_string_length._5_1_ = local_4c.base.sa_data[0xb];
        local_70._M_string_length._6_1_ = local_4c.base.sa_data[0xc];
        local_70._M_string_length._7_1_ = local_4c.base.sa_data[0xd];
        local_70.field_2._M_allocated_capacity = local_4c._16_8_;
        local_70.field_2._8_8_ = ZEXT48(local_4c.v6.sin6_scope_id);
        local_70._M_dataplus._M_p = (pointer)0x1;
      }
      uVar4 = ip_filter::access(this_00,(char *)&local_70,__type);
      if ((uVar4 & 1) != 0) {
        iVar3 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
        if ((char)iVar3 != '\0') {
          if (local_4c.base.sa_family == 2) {
            local_90._0_8_ = (ulong)local_4c.v6.sin6_flowinfo << 0x20;
            local_90[8] = '\0';
            local_90[9] = '\0';
            local_90[10] = '\0';
            local_90[0xb] = '\0';
            local_90[0xc] = '\0';
            local_90[0xd] = '\0';
            local_90[0xe] = '\0';
            local_90[0xf] = '\0';
            local_90._16_8_ = 0;
            local_78 = (element_type *)0x0;
          }
          else {
            local_90[8] = local_4c.base.sa_data[6];
            local_90[9] = local_4c.base.sa_data[7];
            local_90[10] = local_4c.base.sa_data[8];
            local_90[0xb] = local_4c.base.sa_data[9];
            local_90[0xc] = local_4c.base.sa_data[10];
            local_90[0xd] = local_4c.base.sa_data[0xb];
            local_90[0xe] = local_4c.base.sa_data[0xc];
            local_90[0xf] = local_4c.base.sa_data[0xd];
            local_90._16_8_ = local_4c._16_8_;
            local_78 = (element_type *)(ulong)local_4c.v6.sin6_scope_id;
            local_90._0_8_ = (_func_int **)0x1;
          }
          boost::asio::ip::address::to_string_abi_cxx11_(&local_70,(address *)local_90);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"blocked ip from tracker: %s",local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 0x68) >> 8 & 1) == 0) {
          return;
        }
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_90);
        local_70._M_dataplus._M_p = local_70._M_dataplus._M_p & 0xffffffff00000000;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar3),(torrent_handle *)local_90,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_4c.base,(reason_t *)&local_70);
        if ((uchar  [8])local_90._8_8_ == (uchar  [8])0x0) {
          return;
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)(local_90._8_8_ + 0xc);
          iVar3 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar3 = *(int *)(local_90._8_8_ + 0xc);
          *(int *)(local_90._8_8_ + 0xc) = iVar3 + -1;
        }
        if (iVar3 != 1) {
          return;
        }
        (**(code **)(*(long *)local_90._8_8_ + 0x18))();
        return;
      }
    }
    ptVar5 = add_peer(this,(endpoint *)&local_4c.base,(peer_source_flags_t)0x1,
                      (pex_flags_t)((v != V2) * -0x80 + 0x80));
    if (ptVar5 != (torrent_peer *)0x0) {
      state_updated(this);
      iVar3 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar3 != '\0') {
        if (local_4c.base.sa_family == 2) {
          local_90._0_8_ = (ulong)local_4c.v6.sin6_flowinfo << 0x20;
          local_90[8] = '\0';
          local_90[9] = '\0';
          local_90[10] = '\0';
          local_90[0xb] = '\0';
          local_90[0xc] = '\0';
          local_90[0xd] = '\0';
          local_90[0xe] = '\0';
          local_90[0xf] = '\0';
          local_90._16_8_ = 0;
          local_78 = (element_type *)0x0;
        }
        else {
          local_90[8] = local_4c.base.sa_data[6];
          local_90[9] = local_4c.base.sa_data[7];
          local_90[10] = local_4c.base.sa_data[8];
          local_90[0xb] = local_4c.base.sa_data[9];
          local_90[0xc] = local_4c.base.sa_data[10];
          local_90[0xd] = local_4c.base.sa_data[0xb];
          local_90[0xe] = local_4c.base.sa_data[0xc];
          local_90[0xf] = local_4c.base.sa_data[0xd];
          local_90._16_8_ = local_4c._16_8_;
          local_78 = (element_type *)(ulong)local_4c.v6.sin6_scope_id;
          local_90._0_8_ = (_func_int **)0x1;
        }
        boost::asio::ip::address::to_string_abi_cxx11_(&local_70,(address *)local_90);
        ppVar2 = (this->super_torrent_hot_members).m_peer_list._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        if (ppVar2 == (peer_list *)0x0) {
          uVar6 = 0xffffffff;
        }
        else {
          uVar6 = (ulong)(uint)ppVar2->m_num_connect_candidates;
        }
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"name-lookup add_peer() [ %s ] connect-candidates: %d",
                   local_70._M_dataplus._M_p,uVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
    update_want_peers(this);
  }
  return;
}

Assistant:

void torrent::on_peer_name_lookup(error_code const& e
		, std::vector<address> const& host_list, int const port
		, protocol_version const v) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		COMPLETE_ASYNC("torrent::on_peer_name_lookup");

#ifndef TORRENT_DISABLE_LOGGING
		if (e && should_log())
			debug_log("peer name lookup error: %s", e.message().c_str());
#endif

		if (e || m_abort || host_list.empty() || m_ses.is_aborted()) return;

		// TODO: add one peer per IP the hostname resolves to
		tcp::endpoint host(host_list.front(), std::uint16_t(port));

		if (m_ip_filter && m_ip_filter->access(host.address()) & ip_filter::blocked)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("blocked ip from tracker: %s", host.address().to_string().c_str());
			}
#endif
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, host, peer_blocked_alert::ip_filter);
			return;
		}

		if (add_peer(host, peer_info::tracker, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0)))
		{
			state_updated();

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("name-lookup add_peer() [ %s ] connect-candidates: %d"
					, host.address().to_string().c_str()
					, m_peer_list ? m_peer_list->num_connect_candidates() : -1);
			}
#endif
		}
		update_want_peers();
	}
	catch (...) { handle_exception(); }